

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

DynamicType *
Js::JavascriptOperators::EnsureObjectLiteralType
          (ScriptContext *scriptContext,PropertyIdArray *propIds,Type *literalType)

{
  bool bVar1;
  uint uVar2;
  ThreadContext *pTVar3;
  JavascriptLibrary *this;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  DynamicType *pDVar8;
  undefined4 *puVar9;
  uint uVar10;
  
  pTVar3 = scriptContext->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  pDVar8 = literalType->ptr;
  if (pDVar8 == (DynamicType *)0x0) {
    bVar5 = FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    uVar2 = propIds->count;
    if (bVar5) {
      pDVar8 = JavascriptLibrary::GetObjectHeaderInlinedLiteralType(this,(uint16)uVar2);
    }
    else {
      uVar10 = 0x10;
      if (uVar2 < 0x10) {
        uVar10 = uVar2;
      }
      pDVar8 = JavascriptLibrary::GetObjectLiteralType(this,(uint16)uVar10);
    }
    pDVar8 = PathTypeHandlerBase::CreateTypeForNewScObject(scriptContext,pDVar8,propIds,false);
    Memory::Recycler::WBSetBit((char *)literalType);
    literalType->ptr = pDVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(literalType);
  }
  else if (pDVar8->isShared == false) {
    DynamicType::ShareType(pDVar8);
  }
  uVar6 = GetLiteralInlineSlotCapacity(propIds);
  if (uVar6 != ((pDVar8->typeHandler).ptr)->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16fe,
                                "(GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity())"
                                ,
                                "GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity()"
                               );
    if (!bVar5) goto LAB_00ac230e;
    *puVar9 = 0;
  }
  if (((pDVar8->typeHandler).ptr)->slotCapacity < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16ff,"(newType->GetTypeHandler()->GetSlotCapacity() >= 0)",
                                "newType->GetTypeHandler()->GetSlotCapacity() >= 0");
    if (!bVar5) goto LAB_00ac230e;
    *puVar9 = 0;
  }
  uVar6 = GetLiteralInlineSlotCapacity(propIds);
  iVar7 = DynamicTypeHandler::RoundUpSlotCapacity(propIds->count,(PropertyIndex)uVar6);
  if (iVar7 != ((pDVar8->typeHandler).ptr)->slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1700,
                                "(GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity())"
                                ,
                                "GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity()"
                               );
    if (!bVar5) {
LAB_00ac230e:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  pTVar3->noJsReentrancy = bVar1;
  return pDVar8;
}

Assistant:

DynamicType *
    JavascriptOperators::EnsureObjectLiteralType(ScriptContext* scriptContext, const Js::PropertyIdArray *propIds, Field(DynamicType*)* literalType)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(EnsureObjectLiteralType, reentrancylock, scriptContext->GetThreadContext());
        DynamicType * newType = *literalType;
        if (newType != nullptr)
        {
            if (!newType->GetIsShared())
            {
                newType->ShareType();
            }
        }
        else
        {
            DynamicType* objectType =
                FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds)
                    ?   scriptContext->GetLibrary()->GetObjectHeaderInlinedLiteralType((uint16)propIds->count)
                    :   scriptContext->GetLibrary()->GetObjectLiteralType(
                            static_cast<PropertyIndex>(
                                min(propIds->count, static_cast<uint32>(MaxPreInitializedObjectTypeInlineSlotCount))));
            newType = PathTypeHandlerBase::CreateTypeForNewScObject(scriptContext, objectType, propIds, false);
            *literalType = newType;
        }

        Assert(scriptContext);
        Assert(GetLiteralInlineSlotCapacity(propIds) == newType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(newType->GetTypeHandler()->GetSlotCapacity() >= 0);
        Assert(GetLiteralSlotCapacity(propIds) == (uint)newType->GetTypeHandler()->GetSlotCapacity());
        return newType;
        JIT_HELPER_END(EnsureObjectLiteralType);
    }